

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

char * convert_charset_path(char *in_str,Charset from,char *out_str,Charset to)

{
  char16_t *s2;
  
  if ((in_str != (char *)0x0 && out_str != (char *)0x0) &&
     (s2 = (char16_t *)convert_charset(in_str,from,to), s2 != (char16_t *)0x0)) {
    if (to == CS_UTF_16LE) {
      strncpyU16((char16_t *)out_str,s2,0x103);
    }
    else {
      strncpy(out_str,(char *)s2,0x103);
    }
    free(s2);
    return out_str;
  }
  g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
  return (char *)0x0;
}

Assistant:

char *convert_charset_path(const char *in_str, Charset from, char *out_str, Charset to)
{
	if (out_str == NULL || in_str == NULL)
	{
		g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
		return NULL;
	}
	char *temp = convert_charset(in_str, from, to);
	if (temp == NULL)
	{
		g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
		return NULL;
	}
	if (to == CS_UTF_16LE)
	{
		strncpyU16((char16_t *)out_str, (char16_t *)temp, MAX_PATH - 1);
	}
	else
	{
		strncpy(out_str, temp, MAX_PATH - 1);
	}
	free(temp);
	return out_str;
}